

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsound_ctr.c
# Opt level: O3

void device_reset_qsound_ctr(void *info)

{
  *(undefined1 *)((long)info + 0x149c) = 0;
  *(undefined4 *)((long)info + 0x1e) = 0;
  *(undefined2 *)((long)info + 0x1490) = 0;
  *(undefined4 *)((long)info + 0x1498) = 0;
  return;
}

Assistant:

static void device_reset_qsound_ctr(void* info)
{
	struct qsound_chip* chip = (struct qsound_chip*)info;
	
	chip->ready_flag = 0;
	chip->out[0] = chip->out[1] = 0;
	chip->state = 0;
	chip->state_counter = 0;
	
	return;
}